

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O1

void CLASSWEIGHTS::predict_or_learn<false,4>
               (classweights *cweights,single_learner *base,example *ec)

{
  float fVar1;
  
  fVar1 = classweights::get_class_weight(cweights,(ec->l).multi.label);
  ec->weight = fVar1 * ec->weight;
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  return;
}

Assistant:

static void predict_or_learn(classweights& cweights, LEARNER::single_learner& base, example& ec)
{
  switch (pred_type)
  {
    case prediction_type::scalar:
      ec.weight *= cweights.get_class_weight((uint32_t)ec.l.simple.label);
      break;
    case prediction_type::multiclass:
      ec.weight *= cweights.get_class_weight(ec.l.multi.label);
      break;
    default:
      // suppress the warning
      break;
  }

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);
}